

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_is_valid_datatype(int dtype)

{
  undefined4 local_c;
  int dtype_local;
  
  if (((((dtype == 2) || (dtype == 4)) || (dtype == 8)) ||
      (((dtype == 0x10 || (dtype == 0x20)) ||
       ((dtype == 0x40 || ((dtype == 0x80 || (dtype == 0x900)))))))) ||
     ((dtype == 0x100 ||
      (((((dtype == 0x200 || (dtype == 0x300)) || (dtype == 0x400)) ||
        ((dtype == 0x500 || (dtype == 0x600)))) || ((dtype == 0x700 || (dtype == 0x800)))))))) {
    local_c = 1;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

int nifti_is_valid_datatype( int dtype )
{
   if( dtype == NIFTI_TYPE_UINT8        ||
       dtype == NIFTI_TYPE_INT16        ||
       dtype == NIFTI_TYPE_INT32        ||
       dtype == NIFTI_TYPE_FLOAT32      ||
       dtype == NIFTI_TYPE_COMPLEX64    ||
       dtype == NIFTI_TYPE_FLOAT64      ||
       dtype == NIFTI_TYPE_RGB24        ||
       dtype == NIFTI_TYPE_RGBA32       ||
       dtype == NIFTI_TYPE_INT8         ||
       dtype == NIFTI_TYPE_UINT16       ||
       dtype == NIFTI_TYPE_UINT32       ||
       dtype == NIFTI_TYPE_INT64        ||
       dtype == NIFTI_TYPE_UINT64       ||
       dtype == NIFTI_TYPE_FLOAT128     ||
       dtype == NIFTI_TYPE_COMPLEX128   ||
       dtype == NIFTI_TYPE_COMPLEX256 ) return 1;
   return 0;
}